

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O0

ssw_file_t ssw_open_file(char *filename)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  ssw_file_t sVar5;
  long lVar6;
  ssw_fileinternal_t *f_00;
  char *pcVar7;
  FILE *pFVar8;
  long in_RDI;
  uint nmaxunexpected;
  int i;
  int32_t niwr;
  uint64_t nrss_64;
  int64_t np1_64;
  int32_t *bi;
  int64_t current_recpos;
  ssw_fileinternal_t *f;
  ssw_file_t out;
  ssw_file_t in_stack_ffffffffffffffa8;
  ssw_fileinternal_t *in_stack_ffffffffffffffb0;
  int local_44;
  int local_40;
  int local_3c;
  ssw_fileinternal_t *in_stack_ffffffffffffffc8;
  
  if (in_RDI == 0) {
    ssw_error((char *)0x10365d);
  }
  sVar5 = ssw_open_and_procrec0(filename);
  iVar4 = ssw_loadrecord(in_stack_ffffffffffffffc8);
  if (iVar4 == 0) {
    ssw_openerror(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8.internal);
  }
  lVar6 = (*(long *)((long)sVar5.internal + 0x100) - (long)*sVar5.internal) -
          *(long *)((long)sVar5.internal + 0x170);
  piVar2 = *(int **)((long)sVar5.internal + 0x180);
  if ((*(int *)((long)sVar5.internal + 0xf4) == 1) &&
     (0x1f < *(ulong *)((long)sVar5.internal + 0x170))) {
    *(int *)((long)sVar5.internal + 0xdc) = *piVar2;
    *(long *)((long)sVar5.internal + 0x188) = lVar6;
    *(int *)((long)sVar5.internal + 0xe0) = piVar2[2];
    *(long *)((long)sVar5.internal + 400) = lVar6 + 8;
    iVar4 = piVar2[4];
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    *(int *)((long)sVar5.internal + 0xe8) = iVar4;
    *(int *)((long)sVar5.internal + 0xe4) = piVar2[5];
    *(int *)((long)sVar5.internal + 0xec) = piVar2[6];
  }
  else if ((*(int *)((long)sVar5.internal + 0xf4) == 2) &&
          (*(long *)((long)sVar5.internal + 0x170) == 0x14)) {
    *(int *)((long)sVar5.internal + 0xdc) = *piVar2;
    *(long *)((long)sVar5.internal + 0x188) = lVar6;
    *(int *)((long)sVar5.internal + 0xe0) = piVar2[1];
    *(long *)((long)sVar5.internal + 400) = lVar6 + 4;
    *(int *)((long)sVar5.internal + 0xe8) = piVar2[2];
    *(int *)((long)sVar5.internal + 0xe4) = piVar2[3];
    *(int *)((long)sVar5.internal + 0xec) = piVar2[4];
  }
  else if ((*(int *)((long)sVar5.internal + 0xf4) == 3) &&
          (*(long *)((long)sVar5.internal + 0x170) == 0x20)) {
    lVar3 = **(long **)((long)sVar5.internal + 0x180);
    if ((0x7fffffff < lVar3) || (lVar3 < -0x7fffffff)) {
      ssw_openerror(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8.internal);
    }
    *(int *)((long)sVar5.internal + 0xdc) = (int)lVar3;
    *(long *)((long)sVar5.internal + 0x188) = lVar6;
    in_stack_ffffffffffffffc8 =
         *(ssw_fileinternal_t **)(*(long *)((long)sVar5.internal + 0x180) + 8);
    if ((ssw_fileinternal_t *)0x7fffffff < in_stack_ffffffffffffffc8) {
      ssw_openerror(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8.internal);
    }
    *(int *)((long)sVar5.internal + 0xe0) = (int)in_stack_ffffffffffffffc8;
    *(long *)((long)sVar5.internal + 400) = lVar6 + 8;
    *(int *)((long)sVar5.internal + 0xe8) = piVar2[4];
    *(int *)((long)sVar5.internal + 0xe4) = piVar2[5];
    *(int *)((long)sVar5.internal + 0xec) = piVar2[6];
  }
  else if (*(long *)((long)sVar5.internal + 0x170) == 0x28) {
    pFVar8 = (FILE *)ssw_stdout();
    fprintf(pFVar8,
            "ssw_open_file WARNING: File format has header format for which decoding was never tested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
           );
    *(int *)((long)sVar5.internal + 0xdc) = *piVar2;
    *(long *)((long)sVar5.internal + 0x188) = lVar6;
    *(int *)((long)sVar5.internal + 0xe0) = piVar2[2];
    *(long *)((long)sVar5.internal + 400) = lVar6 + 8;
    *(int *)((long)sVar5.internal + 0xe8) = piVar2[4];
    *(int *)((long)sVar5.internal + 0xe4) = piVar2[6];
    *(int *)((long)sVar5.internal + 0xec) = piVar2[8];
  }
  else {
    ssw_openerror(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8.internal);
  }
  f_00 = (ssw_fileinternal_t *)ssw_stdout();
  pcVar7 = ssw_mcnpflavour(in_stack_ffffffffffffffa8);
  fprintf((FILE *)f_00,"ssw_open_file:    File layout detected : %s\n",pcVar7);
  pFVar8 = (FILE *)ssw_stdout();
  fprintf(pFVar8,"ssw_open_file:    Code ID fields : \"%s\" / \"%s\"\n",(long)sVar5.internal + 4);
  pFVar8 = (FILE *)ssw_stdout();
  fprintf(pFVar8,"ssw_open_file:    Title field : \"%s\"\n",(long)sVar5.internal + 0x58);
  pFVar8 = (FILE *)ssw_stdout();
  uVar1 = *(uint *)((long)sVar5.internal + 0xdc);
  if ((int)uVar1 < 1) {
    uVar1 = -uVar1;
  }
  fprintf(pFVar8,"ssw_open_file:    Source statistics (histories): %11i\n",(ulong)uVar1);
  pFVar8 = (FILE *)ssw_stdout();
  fprintf(pFVar8,"ssw_open_file:    Particles in file            : %11i\n",
          (ulong)*(uint *)((long)sVar5.internal + 0xe0));
  pFVar8 = (FILE *)ssw_stdout();
  fprintf(pFVar8,"ssw_open_file:    Number of surfaces           : %11i\n",
          (ulong)*(uint *)((long)sVar5.internal + 0xe4));
  pFVar8 = (FILE *)ssw_stdout();
  fprintf(pFVar8,"ssw_open_file:    Histories at surfaces        : %11i\n",
          (ulong)*(uint *)((long)sVar5.internal + 0xec));
  if (*(int *)((long)sVar5.internal + 0xe8) == 6) {
    ssw_openerror(f_00,(char *)in_stack_ffffffffffffffa8.internal);
  }
  if (*(int *)((long)sVar5.internal + 0xe8) < 10) {
    ssw_openerror(f_00,(char *)in_stack_ffffffffffffffa8.internal);
  }
  if (0xb < *(int *)((long)sVar5.internal + 0xe8)) {
    ssw_openerror(f_00,(char *)in_stack_ffffffffffffffa8.internal);
  }
  if ((*(int *)((long)sVar5.internal + 0xf4) == 1) && (*(int *)((long)sVar5.internal + 0xe8) == 10))
  {
    ssw_openerror(f_00,(char *)in_stack_ffffffffffffffa8.internal);
  }
  local_3c = 0;
  if (*(int *)((long)sVar5.internal + 0xdc) == 0) {
    ssw_openerror(f_00,(char *)in_stack_ffffffffffffffa8.internal);
  }
  if (*(int *)((long)sVar5.internal + 0xdc) < 0) {
    *(int *)((long)sVar5.internal + 0xdc) = -*(int *)((long)sVar5.internal + 0xdc);
    iVar4 = ssw_loadrecord(in_stack_ffffffffffffffc8);
    if (iVar4 == 0) {
      ssw_openerror(f_00,(char *)in_stack_ffffffffffffffa8.internal);
    }
    local_3c = *piVar2;
  }
  for (local_40 = 0; local_40 < *(int *)((long)sVar5.internal + 0xe4) + local_3c + 1;
      local_40 = local_40 + 1) {
    iVar4 = ssw_loadrecord(in_stack_ffffffffffffffc8);
    if (iVar4 == 0) {
      ssw_openerror(f_00,(char *)in_stack_ffffffffffffffa8.internal);
    }
  }
  *(undefined4 *)((long)sVar5.internal + 0xf0) = 0;
  *(undefined8 *)((long)sVar5.internal + 0x198) = *(undefined8 *)((long)sVar5.internal + 0x100);
  local_44 = 3;
  while( true ) {
    if (local_44 == 0) {
      return (ssw_file_t)sVar5.internal;
    }
    iVar4 = ssw_loadrecord(in_stack_ffffffffffffffc8);
    if (iVar4 == 0) {
      if (*(int *)((long)sVar5.internal + 0xe0) == 0) {
        return (ssw_file_t)sVar5.internal;
      }
      ssw_openerror(f_00,(char *)in_stack_ffffffffffffffa8.internal);
    }
    if ((0 < *(int *)((long)sVar5.internal + 0xe0)) &&
       (*(ulong *)((long)sVar5.internal + 0x170) ==
        (ulong)(uint)(*(int *)((long)sVar5.internal + 0xe8) << 3))) break;
    *(long *)((long)sVar5.internal + 0x198) =
         (long)(*sVar5.internal << 1) + *(long *)((long)sVar5.internal + 0x170) +
         *(long *)((long)sVar5.internal + 0x198);
    pFVar8 = (FILE *)ssw_stdout();
    fprintf(pFVar8,
            "ssw_open_file WARNING: Unexpected %llu byte record encountered at end of header. Continuing under the assumption it contains valid configuration data.\n"
            ,*(undefined8 *)((long)sVar5.internal + 0x170));
    local_44 = local_44 + -1;
  }
  return (ssw_file_t)sVar5.internal;
}

Assistant:

ssw_file_t ssw_open_file( const char * filename )
{
  if (!filename)
    ssw_error("ssw_open_file called with null string for filename");

  //Open, classify and process first record with mcnp type and version info:

  ssw_file_t out = ssw_open_and_procrec0( filename );
  ssw_fileinternal_t * f = (ssw_fileinternal_t *)out.internal; assert(f);

  //Skip a record:
  if (!ssw_loadrecord(f))
    ssw_openerror(f,"ssw_open_file error: problems loading record (A)");

  //Position of current record payload in file:
  int64_t current_recpos = (int64_t)f->filehandle.current_pos;
  current_recpos -= f->reclen;
  current_recpos -= f->lbuf;

  //Read size data and mark position of nrss & np1 variables.
  int32_t * bi = (int32_t*)f->buf;
  if ( (f->mcnp_type == SSW_MCNP6) && f->lbuf>=32 ) {
    f->np1 = bi[0];
    f->np1pos = current_recpos + 0 * sizeof(int32_t);
    f->nrss = bi[2];
    f->nrsspos = current_recpos + 2 * sizeof(int32_t);
    f->nrcd = abs(bi[4]);
    f->njsw = bi[5];
    f->niss = bi[6];
  } else if ( (f->mcnp_type == SSW_MCNPX) && f->lbuf==20 ) {
    f->np1 = bi[0];
    f->np1pos = current_recpos + 0 * sizeof(int32_t);
    f->nrss = bi[1];
    f->nrsspos = current_recpos + 1 * sizeof(int32_t);
    f->nrcd = bi[2];
    f->njsw = bi[3];
    f->niss = bi[4];
  } else if ( (f->mcnp_type == SSW_MCNP5) && f->lbuf==32 ) {
    int64_t np1_64 = ((int64_t*)f->buf)[0];
    if (np1_64 > 2147483647 || np1_64 < -2147483647)
      ssw_openerror(f,"ssw_open_file error: MCNP5 files with more than 2147483647"
                    " histories are not supported");
    f->np1 = (int32_t)np1_64;
    f->np1pos = current_recpos + 0 * sizeof(int64_t);
    uint64_t nrss_64 = ((uint64_t*)f->buf)[1];
    if (nrss_64 > 2147483647 )
      ssw_openerror(f,"ssw_open_file error: MCNP5 files with more than 2147483647"
                    " particles are not supported");
    f->nrss = (int32_t)nrss_64;
    f->nrsspos = current_recpos + 1 * sizeof(int64_t);
    f->nrcd = bi[4];
    f->njsw = bi[5];
    f->niss = bi[6];
  } else if (f->lbuf==40) {
    fprintf(ssw_stdout(),"ssw_open_file WARNING: File format has header format for which decoding was never tested (feedback"
            " appreciated at https://mctools.github.io/mcpl/contact/).\n");
    f->np1 = bi[0];
    f->np1pos = current_recpos + 0 * sizeof(int32_t);
    f->nrss = bi[2];
    f->nrsspos = current_recpos + 2 * sizeof(int32_t);
    f->nrcd = bi[4];
    f->njsw = bi[6];
    f->niss = bi[8];
  } else {
    ssw_openerror(f,"ssw_open_file error: Unexpected record length");
  }

  fprintf(ssw_stdout(),"ssw_open_file:    File layout detected : %s\n",ssw_mcnpflavour(out));
  fprintf(ssw_stdout(),"ssw_open_file:    Code ID fields : \"%s\" / \"%s\"\n",f->kods,f->vers);
  fprintf(ssw_stdout(),"ssw_open_file:    Title field : \"%s\"\n",f->aids);
  /* fprintf(ssw_stdout(),"ssw_open_file: Found kods  = '%s'\n",f->kods); */
  /* fprintf(ssw_stdout(),"ssw_open_file: Found vers  = '%s'\n",f->vers); */
  /* fprintf(ssw_stdout(),"ssw_open_file: Found lods  = '%s'\n",f->lods); */
  /* fprintf(ssw_stdout(),"ssw_open_file: Found idtms = '%s'\n",f->idtms); */
  /* fprintf(ssw_stdout(),"ssw_open_file: Found probs = '%s'\n",f->probs); */
  /* fprintf(ssw_stdout(),"ssw_open_file: Found aids  = '%s'\n",f->aids); */
  fprintf(ssw_stdout(),"ssw_open_file:    Source statistics (histories): %11i\n" , abs(f->np1));
  fprintf(ssw_stdout(),"ssw_open_file:    Particles in file            : %11i\n" , f->nrss);
  fprintf(ssw_stdout(),"ssw_open_file:    Number of surfaces           : %11i\n" , f->njsw);
  fprintf(ssw_stdout(),"ssw_open_file:    Histories at surfaces        : %11i\n" , f->niss);
  //  fprintf(ssw_stdout(),"ssw_open_file: File length of SSB array          : %11i\n" , f->nrcd);

  if(f->nrcd==6)
    ssw_openerror(f,"ssw_open_file error: SSW files with spherical sources are not currently supported.");
  if(f->nrcd<10)
    ssw_openerror(f,"ssw_open_file error: Too short SSB arrays in file");
  if(f->nrcd>11)
    ssw_openerror(f,"ssw_open_file error: Unexpected length of SSB arrays in file");

  if ( (f->mcnp_type == SSW_MCNP6) && f->nrcd==10 )
    ssw_openerror(f,"ssw_open_file error: Unexpected length of SSB arrays in MCNP6 file");

  int32_t niwr = 0;
  if (f->np1==0)
    ssw_openerror(f,"ssw_open_file error: File has 0 particle histories which should not be possible");

  if (f->np1<0) {//Sign is well-defined since f->np1!=0
    f->np1 = - f->np1;
    if (!ssw_loadrecord(f))
      ssw_openerror(f,"ssw_open_file error: problems loading record (B)");
    niwr = bi[0];
    //mipts = bi[1];//source particle type
    //kjaq  = bi[2];//macrobody facet flag
  }

  //skip over njsw + niwr + 1 records which we are not interested in:
  int i;
  for (i = 0; i < f->njsw+niwr+1; ++i) {
    if (!ssw_loadrecord(f))
      ssw_openerror(f,"ssw_open_file error: problems loading record (C)");
  }

  //End of header? Mark the position:
  f->pos = 0;
  f->headlen = (size_t)f->filehandle.current_pos;

  //Check that it was really the end of the header by preloading the next
  //record(s) and checking if the length corresponds to that of particle data
  //(NB: ssw_load_particle knows that the particle at position 0 will have
  //already been loaded by these checks). See also
  //https://github.com/mctools/mcpl/issues/45:
  unsigned nmaxunexpected = 3;
  while ( nmaxunexpected-- > 0 ) {
    if (!ssw_loadrecord(f)) {
      //For files with 0 particles, we assume (this is not guaranteed of
      //course!) that the failure is due to EOF:
      if (f->nrss==0)
        break;
      //But this is certainly an error for files with >0 particles:
      ssw_openerror(f,"ssw_open_file error: problems loading record (D)");
    }
    if ( f->nrss > 0 && f->lbuf == (unsigned)8*f->nrcd ) {
      //Looks like we preloaded the first particle of the file!
      break;
    } else {
      //Looks like this could not be a particle, so we interpret this as if the
      //header was actually one record longer than previously thought:
      f->headlen += f->reclen * 2 + f->lbuf;
      fprintf( ssw_stdout(),
               "ssw_open_file WARNING: Unexpected %llu byte record encountered"
               " at end of header. Continuing under the assumption it"
               " contains valid configuration data.\n",
               (unsigned long long)f->lbuf );
    }
  }

  //Return handle:
  out.internal = f;
  return out;
}